

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::ComputeSolutionHCurlT<std::complex<double>>
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<std::complex<double>_> *sol,
          TPZSolVec<std::complex<double>_> *curlSol)

{
  int iVar1;
  long *plVar2;
  TPZCompMesh *pTVar3;
  TPZManVector<std::complex<double>,_10> *pTVar4;
  TPZConnect *this_00;
  complex<double> *pcVar5;
  TPZVec<TPZManVector<std::complex<double>,_10>_> *in_RCX;
  long *in_RDX;
  long *in_RDI;
  TPZVec<TPZManVector<std::complex<double>,_10>_> *in_R8;
  int coord_1;
  int coord;
  long iSol_1;
  int jShape;
  int pos;
  int nShapeCon;
  int64_t conSeqN;
  TPZConnect *con;
  int iCon;
  int ishape;
  TPZBlock *block;
  TPZCompEl *in_stack_000000c0;
  long iSol;
  long numberSol;
  TPZFMatrix<std::complex<double>_> *meshSol;
  int nConnects;
  int nVar;
  int curlDim;
  int dim;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  TPZSolutionMatrix *in_stack_fffffffffffffee0;
  int64_t in_stack_fffffffffffffef8;
  TPZFMatrix<double> *in_stack_ffffffffffffff00;
  int64_t in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar6;
  complex<double> *in_stack_ffffffffffffff28;
  TPZVec<std::complex<double>_> *in_stack_ffffffffffffff30;
  int local_ac;
  long local_a8;
  int local_9c;
  int local_80;
  int local_7c;
  complex<double> local_70;
  complex<double> local_60;
  long local_50;
  int64_t local_48;
  TPZFMatrix<std::complex<double>_> *local_40;
  int local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  TPZVec<TPZManVector<std::complex<double>,_10>_> *local_28;
  TPZVec<TPZManVector<std::complex<double>,_10>_> *local_20;
  long *local_18;
  
  local_2c = 2;
  local_30 = 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  plVar2 = (long *)(**(code **)(*in_RDI + 0xb8))();
  local_34 = (**(code **)(*plVar2 + 0x78))();
  local_38 = (**(code **)(*in_RDI + 0x90))();
  pTVar3 = TPZCompEl::Mesh(in_stack_000000c0);
  TPZCompMesh::Solution(pTVar3);
  local_40 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_fffffffffffffee0);
  local_48 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_40);
  (*local_20->_vptr_TPZVec[3])(local_20,local_48);
  (*local_28->_vptr_TPZVec[3])(local_28,local_48);
  for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_20,local_50);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,2);
    in_stack_fffffffffffffee0 =
         (TPZSolutionMatrix *)
         TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_20,local_50);
    std::complex<double>::complex(&local_60,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_28,local_50);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,1);
    TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_28,local_50);
    std::complex<double>::complex(&local_70,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
  }
  pTVar3 = TPZCompEl::Mesh(in_stack_000000c0);
  TPZCompMesh::Block(pTVar3);
  local_7c = 0;
  for (local_80 = 0; local_80 < local_38; local_80 = local_80 + 1) {
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_80);
    TPZConnect::SequenceNumber(this_00);
    iVar1 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    for (local_9c = 0; local_9c < iVar1; local_9c = local_9c + 1) {
      for (local_a8 = 0; local_a8 < local_48; local_a8 = local_a8 + 1) {
        for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
          TPZFMatrix<std::complex<double>_>::operator()
                    ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8,(int64_t)in_RDI);
          TPZFMatrix<double>::operator()
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int64_t)in_RDI);
          std::operator*((complex<double> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                         (double *)0x1bde354);
          pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_20,local_a8);
          TPZVec<std::complex<double>_>::operator[]
                    (&pTVar4->super_TPZVec<std::complex<double>_>,(long)local_ac);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_fffffffffffffee0,
                     (complex<double> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        }
        for (iVar6 = 0; iVar6 < 1; iVar6 = iVar6 + 1) {
          pcVar5 = TPZFMatrix<std::complex<double>_>::operator()
                             ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8,(int64_t)in_RDI);
          in_stack_ffffffffffffff00 = *(TPZFMatrix<double> **)pcVar5->_M_value;
          in_stack_fffffffffffffef8 =
               (**(code **)(*local_18 + 0x108))(local_18,(long)iVar6,(long)local_7c);
          std::operator*((complex<double> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                         (double *)0x1bde41c);
          pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[](local_28,local_a8);
          TPZVec<std::complex<double>_>::operator[]
                    (&pTVar4->super_TPZVec<std::complex<double>_>,(long)iVar6);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_fffffffffffffee0,
                     (complex<double> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        }
      }
      local_7c = local_7c + 1;
    }
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}